

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_json.cpp
# Opt level: O0

void __thiscall cppcms::rpc::json_call::check_not_notification(json_call *this)

{
  bool bVar1;
  json_call *in_RDI;
  string *in_stack_ffffffffffffffa8;
  call_error *this_00;
  allocator local_29;
  string local_28 [40];
  
  bVar1 = notification(in_RDI);
  if (!bVar1) {
    return;
  }
  this_00 = (call_error *)__cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"Notification method should not return response",&local_29);
  call_error::call_error(this_00,in_stack_ffffffffffffffa8);
  __cxa_throw(this_00,&call_error::typeinfo,call_error::~call_error);
}

Assistant:

void json_call::check_not_notification()
	{
		if(notification())
			throw call_error("Notification method should not return response");
	}